

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

void basic_publish(amqp_connection_state_t connectionState_,char *message_)

{
  int iVar1;
  amqp_bytes_t body;
  amqp_bytes_t exchange;
  amqp_bytes_t routing_key;
  amqp_bytes_t message_bytes;
  amqp_basic_properties_t local_e8;
  
  body = amqp_cstring_bytes(message_);
  local_e8._flags = 0x1000;
  local_e8.delivery_mode = '\x01';
  exchange = amqp_cstring_bytes("");
  routing_key = amqp_cstring_bytes("test_queue");
  iVar1 = amqp_basic_publish(connectionState_,1,exchange,routing_key,1,0,&local_e8,body);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("retval == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x4b,"void basic_publish(amqp_connection_state_t, const char *)");
}

Assistant:

void basic_publish(amqp_connection_state_t connectionState_,
                   const char *message_) {
  amqp_bytes_t message_bytes = amqp_cstring_bytes(message_);

  amqp_basic_properties_t properties;
  properties._flags = 0;

  properties._flags |= AMQP_BASIC_DELIVERY_MODE_FLAG;
  properties.delivery_mode = AMQP_DELIVERY_NONPERSISTENT;

  int retval = amqp_basic_publish(
      connectionState_, fixed_channel_id, amqp_cstring_bytes(""),
      amqp_cstring_bytes(test_queue_name),
      /* mandatory=*/1,
      /* immediate=*/0, /* RabbitMQ 3.x does not support the "immediate" flag
                          according to
                          https://www.rabbitmq.com/specification.html */
      &properties, message_bytes);

  assert(retval == 0);
}